

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

void matrixadd(float32 **a,float32 **b,int32 n)

{
  float32 *pfVar1;
  float32 *pfVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (0 < n) {
    uVar3 = 0;
    do {
      pfVar1 = b[uVar3];
      pfVar2 = a[uVar3];
      uVar4 = 0;
      do {
        pfVar2[uVar4] = (float32)((float)pfVar1[uVar4] + (float)pfVar2[uVar4]);
        uVar4 = uVar4 + 1;
      } while ((uint)n != uVar4);
      uVar3 = uVar3 + 1;
    } while (uVar3 != (uint)n);
  }
  return;
}

Assistant:

void
matrixadd(float32 ** a, float32 ** b, int32 n)
{
    int32 i, j;

    for (i = 0; i < n; ++i)
        for (j = 0; j < n; ++j)
            a[i][j] += b[i][j];
}